

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_align_test.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::anon_unknown_0::ArenaAlignDefault_CeilDefaultAligned_Test::
~ArenaAlignDefault_CeilDefaultAligned_Test(ArenaAlignDefault_CeilDefaultAligned_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ArenaAlignDefault, CeilDefaultAligned) {
  alignas(8) char p[17] = {0};
  auto align_default = ArenaAlignDefault();
  EXPECT_THAT(align_default.CeilDefaultAligned(p + 0), Eq(p + 0));
  EXPECT_THAT(align_default.CeilDefaultAligned(p + 8), Eq(p + 8));
  EXPECT_THAT(align_default.CeilDefaultAligned(p + 16), Eq(p + 16));
#if GTEST_HAS_DEATH_TEST
  EXPECT_DEBUG_DEATH(align_default.CeilDefaultAligned(p + 1), ".*");
  EXPECT_DEBUG_DEATH(align_default.CeilDefaultAligned(p + 7), ".*");
  EXPECT_DEBUG_DEATH(align_default.CeilDefaultAligned(p + 9), ".*");
  EXPECT_DEBUG_DEATH(align_default.CeilDefaultAligned(p + 15), ".*");
  EXPECT_DEBUG_DEATH(align_default.CeilDefaultAligned(p + 17), ".*");
#endif  // GTEST_HAS_DEATH_TEST
}